

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nelder_mead.cpp
# Opt level: O0

bool __thiscall nelder_mead::run_iteration(nelder_mead *this)

{
  pointer *__return_storage_ptr__;
  reference pvVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined1 local_130 [4];
  float pc_value;
  vector<float,_std::allocator<float>_> local_118;
  undefined1 local_100 [8];
  vector<float,_std::allocator<float>_> pc;
  undefined1 local_e0 [4];
  float pe_value;
  vector<float,_std::allocator<float>_> local_c8;
  undefined1 local_b0 [8];
  vector<float,_std::allocator<float>_> pe;
  float pr_value;
  vector<float,_std::allocator<float>_> local_80;
  vector<float,_std::allocator<float>_> local_68;
  undefined1 local_50 [8];
  vector<float,_std::allocator<float>_> pr;
  vector<float,_std::allocator<float>_> center_of_mass;
  float b;
  float a;
  nelder_mead *this_local;
  
  find_min_max_error(this);
  if ((ABS(this->_min_error) + ABS(this->_max_error)) * this->_iteration_epsilon <=
      ABS(ABS(this->_min_error) - ABS(this->_max_error)) * 2.0) {
    __return_storage_ptr__ =
         &pr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
    get_center_of_mass((vector<float,_std::allocator<float>_> *)__return_storage_ptr__,this);
    pvVar1 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](&this->_simplex,(long)this->_max_index);
    vector_utils::sub(&local_80,(vector<float,_std::allocator<float>_> *)__return_storage_ptr__,
                      pvVar1);
    vector_utils::mul(&local_68,&local_80,1.0);
    vector_utils::add((vector<float,_std::allocator<float>_> *)local_50,
                      (vector<float,_std::allocator<float>_> *)
                      &pr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,&local_68);
    std::vector<float,_std::allocator<float>_>::~vector(&local_68);
    std::vector<float,_std::allocator<float>_>::~vector(&local_80);
    (*this->_estimator->_vptr_error_estimator[2])(this->_estimator,local_50);
    if ((extraout_XMM0_Da < this->_min_error) || (this->_almost_max_error <= extraout_XMM0_Da)) {
      if (this->_min_error <= extraout_XMM0_Da) {
        if ((extraout_XMM0_Da < this->_min_error) || (this->_max_error < extraout_XMM0_Da)) {
          pvVar1 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](&this->_simplex,(long)this->_max_index);
          vector_utils::sub((vector<float,_std::allocator<float>_> *)local_130,pvVar1,
                            (vector<float,_std::allocator<float>_> *)
                            &pr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
          vector_utils::mul(&local_118,(vector<float,_std::allocator<float>_> *)local_130,0.5);
          vector_utils::add((vector<float,_std::allocator<float>_> *)local_100,
                            (vector<float,_std::allocator<float>_> *)
                            &pr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,&local_118);
          std::vector<float,_std::allocator<float>_>::~vector(&local_118);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_130);
          (*this->_estimator->_vptr_error_estimator[2])(this->_estimator,local_100);
          if (extraout_XMM0_Da_01 < this->_max_error) {
            pvVar1 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[](&this->_simplex,(long)this->_max_index);
            std::vector<float,_std::allocator<float>_>::operator=
                      (pvVar1,(vector<float,_std::allocator<float>_> *)local_100);
          }
          else {
            reduce_simplex(this,this->_min_index);
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_100);
        }
        else {
          pvVar1 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](&this->_simplex,(long)this->_max_index);
          std::vector<float,_std::allocator<float>_>::operator=
                    (pvVar1,(vector<float,_std::allocator<float>_> *)local_50);
        }
      }
      else {
        vector_utils::sub((vector<float,_std::allocator<float>_> *)local_e0,
                          (vector<float,_std::allocator<float>_> *)local_50,
                          (vector<float,_std::allocator<float>_> *)
                          &pr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        vector_utils::mul(&local_c8,(vector<float,_std::allocator<float>_> *)local_e0,2.0);
        vector_utils::add((vector<float,_std::allocator<float>_> *)local_b0,
                          (vector<float,_std::allocator<float>_> *)
                          &pr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&local_c8);
        std::vector<float,_std::allocator<float>_>::~vector(&local_c8);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_e0);
        (*this->_estimator->_vptr_error_estimator[2])(this->_estimator,local_b0);
        if (extraout_XMM0_Da <= extraout_XMM0_Da_00) {
          pvVar1 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](&this->_simplex,(long)this->_max_index);
          std::vector<float,_std::allocator<float>_>::operator=
                    (pvVar1,(vector<float,_std::allocator<float>_> *)local_50);
        }
        else {
          pvVar1 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](&this->_simplex,(long)this->_max_index);
          std::vector<float,_std::allocator<float>_>::operator=
                    (pvVar1,(vector<float,_std::allocator<float>_> *)local_b0);
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_b0);
      }
    }
    else {
      pvVar1 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&this->_simplex,(long)this->_almost_max_index);
      std::vector<float,_std::allocator<float>_>::operator=
                (pvVar1,(vector<float,_std::allocator<float>_> *)local_50);
    }
    this_local._7_1_ = true;
    pe.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_50);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &pr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool nelder_mead::run_iteration()
{
  find_min_max_error();

  /*
  if (get_simplex_norm() < _iteration_epsilon)
  {
    return false;
  }
  */

  // stop if difference between maximum and minimum value is very low
  // read the source: Numerical Recipes in C++ (3rd Ed.)
  float a = fabsf(_min_error);
  float b = fabsf(_max_error);

  if (2.0f * fabsf(a - b) < (a + b) * _iteration_epsilon)
  {
    return false;
  }

  auto center_of_mass = get_center_of_mass();

  auto pr = vector_utils::add(center_of_mass, vector_utils::mul(
    vector_utils::sub(center_of_mass, _simplex[_max_index]),
    _reflection_coeff
  ));

  auto pr_value = _estimator->estimate_error(pr);

  // this almost maximum error comparison comes from Wikipedia article
  // refer: 'One possible variation of the NM algorithm' section
  if (pr_value >= _min_error && pr_value < _almost_max_error)
  {
    _simplex[_almost_max_index] = pr;
    return true;
  }
  else if (pr_value < _min_error)
  {
    auto pe = vector_utils::add(center_of_mass, vector_utils::mul(
      vector_utils::sub(pr, center_of_mass),
      _expansion_coeff
    ));

    auto pe_value = _estimator->estimate_error(pe);

    if (pe_value < pr_value) // expansion
    {
      _simplex[_max_index] = pe;
    }
    else // reflection
    {
      _simplex[_max_index] = pr;
    }
  }
  else
  {
    if (_min_error <= pr_value && pr_value <= _max_error) // reflection
    {
      _simplex[_max_index] = pr;
    }
    else
    {
      auto pc = vector_utils::add(center_of_mass, vector_utils::mul(
        vector_utils::sub(_simplex[_max_index], center_of_mass),
        _contraction_coeff
      ));

      auto pc_value = _estimator->estimate_error(pc);

      if (pc_value >= _max_error)
      {
        reduce_simplex(_min_index);
      }
      else // contraction
      {
        _simplex[_max_index] = pc;
      }
    }
  }

  return true;
}